

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.h
# Opt level: O0

bool __thiscall Assimp::NFFImporter::ShadingInfo::operator==(ShadingInfo *this,ShadingInfo *other)

{
  bool bVar1;
  __type _Var2;
  bool local_19;
  ShadingInfo *other_local;
  ShadingInfo *this_local;
  
  bVar1 = aiColor3D::operator==(&this->color,&other->color);
  local_19 = false;
  if (bVar1) {
    bVar1 = aiColor3D::operator==(&this->diffuse,&other->diffuse);
    local_19 = false;
    if (bVar1) {
      bVar1 = aiColor3D::operator==(&this->specular,&other->specular);
      local_19 = false;
      if (bVar1) {
        bVar1 = aiColor3D::operator==(&this->ambient,&other->ambient);
        local_19 = false;
        if (bVar1) {
          local_19 = false;
          if ((this->refracti == other->refracti) && (!NAN(this->refracti) && !NAN(other->refracti))
             ) {
            _Var2 = std::operator==(&this->texFile,&other->texFile);
            local_19 = false;
            if ((_Var2) && (local_19 = false, (this->twoSided & 1U) == (other->twoSided & 1U))) {
              local_19 = (this->shaded & 1U) == (other->shaded & 1U);
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool operator == (const ShadingInfo& other) const
        {
            return color == other.color     &&
                diffuse  == other.diffuse   &&
                specular == other.specular  &&
                ambient  == other.ambient   &&
                refracti == other.refracti  &&
                texFile  == other.texFile   &&
                twoSided == other.twoSided  &&
                shaded   == other.shaded;

            // Some properties from NFF2 aren't compared by this operator.
            // Comparing MeshInfo::matIndex should do that.
        }